

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O0

void __thiscall basist::huffman_decoding_table::clear(huffman_decoding_table *this)

{
  vector<int> *in_RDI;
  
  basisu::clear_vector<basisu::vector<unsigned_char>>((vector<unsigned_char> *)in_RDI);
  basisu::clear_vector<basisu::vector<int>>(in_RDI);
  basisu::clear_vector<basisu::vector<short>>((vector<short> *)in_RDI);
  return;
}

Assistant:

void clear()
		{
			basisu::clear_vector(m_code_sizes);
			basisu::clear_vector(m_lookup);
			basisu::clear_vector(m_tree);
		}